

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullWriter.cpp
# Opt level: O2

StepStatus __thiscall
adios2::core::engine::NullWriter::BeginStep(NullWriter *this,StepMode mode,float timeoutSeconds)

{
  NullWriterImpl *pNVar1;
  allocator local_8c;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  pNVar1 = (this->Impl)._M_t.
           super___uniq_ptr_impl<adios2::core::engine::NullWriter::NullWriterImpl,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::core::engine::NullWriter::NullWriterImpl_*,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
           .super__Head_base<0UL,_adios2::core::engine::NullWriter::NullWriterImpl_*,_false>.
           _M_head_impl;
  if (pNVar1->IsOpen == false) {
    std::__cxx11::string::string((string *)&local_28,"Engine",&local_89);
    std::__cxx11::string::string((string *)&local_48,"NullWriter",&local_8a);
    std::__cxx11::string::string((string *)&local_68,"BeginStep",&local_8b);
    std::__cxx11::string::string
              ((string *)&local_88,"NullWriter::BeginStep: Engine already closed",&local_8c);
    helper::Throw<std::runtime_error>(&local_28,&local_48,&local_68,&local_88,-1);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
    pNVar1 = (this->Impl)._M_t.
             super___uniq_ptr_impl<adios2::core::engine::NullWriter::NullWriterImpl,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_adios2::core::engine::NullWriter::NullWriterImpl_*,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
             .super__Head_base<0UL,_adios2::core::engine::NullWriter::NullWriterImpl_*,_false>.
             _M_head_impl;
  }
  if (pNVar1->IsInStep == true) {
    std::__cxx11::string::string((string *)&local_28,"Engine",&local_89);
    std::__cxx11::string::string((string *)&local_48,"NullWriter",&local_8a);
    std::__cxx11::string::string((string *)&local_68,"BeginStep",&local_8b);
    std::__cxx11::string::string
              ((string *)&local_88,"NullWriter::BeginStep: Step already active",&local_8c);
    helper::Throw<std::runtime_error>(&local_28,&local_48,&local_68,&local_88,-1);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
    pNVar1 = (this->Impl)._M_t.
             super___uniq_ptr_impl<adios2::core::engine::NullWriter::NullWriterImpl,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_adios2::core::engine::NullWriter::NullWriterImpl_*,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
             .super__Head_base<0UL,_adios2::core::engine::NullWriter::NullWriterImpl_*,_false>.
             _M_head_impl;
  }
  pNVar1->IsInStep = true;
  pNVar1->CurrentStep = pNVar1->CurrentStep + 1;
  return OK;
}

Assistant:

StepStatus NullWriter::BeginStep(StepMode mode, const float timeoutSeconds)
{
    if (!Impl->IsOpen)
    {
        helper::Throw<std::runtime_error>("Engine", "NullWriter", "BeginStep",
                                          "NullWriter::BeginStep: Engine already closed");
    }

    if (Impl->IsInStep)
    {
        helper::Throw<std::runtime_error>("Engine", "NullWriter", "BeginStep",
                                          "NullWriter::BeginStep: Step already active");
    }

    Impl->IsInStep = true;
    ++Impl->CurrentStep;
    return StepStatus::OK;
}